

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<FunctionDef>::moveAppend
          (QGenericArrayOps<FunctionDef> *this,FunctionDef *b,FunctionDef *e)

{
  FunctionDef *pFVar1;
  Data *pDVar2;
  char *pcVar3;
  qsizetype qVar4;
  Data *pDVar5;
  ArgumentDef *pAVar6;
  undefined8 uVar7;
  FunctionDef *pFVar8;
  TypeTags TVar9;
  int iVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  qsizetype qVar18;
  
  if ((b != e) && (b < e)) {
    pFVar1 = (this->super_QArrayDataPointer<FunctionDef>).ptr;
    qVar18 = (this->super_QArrayDataPointer<FunctionDef>).size;
    do {
      pDVar2 = (b->type).name.d.d;
      (b->type).name.d.d = (Data *)0x0;
      pFVar1[qVar18].type.name.d.d = pDVar2;
      pcVar3 = (b->type).name.d.ptr;
      (b->type).name.d.ptr = (char *)0x0;
      pFVar1[qVar18].type.name.d.ptr = pcVar3;
      qVar4 = (b->type).name.d.size;
      (b->type).name.d.size = 0;
      pFVar1[qVar18].type.name.d.size = qVar4;
      pDVar2 = (b->type).rawName.d.d;
      (b->type).rawName.d.d = (Data *)0x0;
      pFVar1[qVar18].type.rawName.d.d = pDVar2;
      pcVar3 = (b->type).rawName.d.ptr;
      (b->type).rawName.d.ptr = (char *)0x0;
      pFVar1[qVar18].type.rawName.d.ptr = pcVar3;
      qVar4 = (b->type).rawName.d.size;
      (b->type).rawName.d.size = 0;
      pFVar1[qVar18].type.rawName.d.size = qVar4;
      TVar9.super_QFlagsStorageHelper<TypeTag,_4>.super_QFlagsStorage<TypeTag>.i =
           (b->type).typeTag.super_QFlagsStorageHelper<TypeTag,_4>;
      uVar7 = *(undefined8 *)&(b->type).firstToken;
      pFVar8 = pFVar1 + qVar18;
      *(undefined4 *)&(pFVar8->type).field_0x30 = *(undefined4 *)&(b->type).field_0x30;
      (pFVar8->type).typeTag =
           (TypeTags)TVar9.super_QFlagsStorageHelper<TypeTag,_4>.super_QFlagsStorage<TypeTag>.i;
      *(undefined8 *)(&(pFVar8->type).field_0x30 + 8) = uVar7;
      pDVar5 = (b->arguments).d.d;
      (b->arguments).d.d = (Data *)0x0;
      pFVar1[qVar18].arguments.d.d = pDVar5;
      pAVar6 = (b->arguments).d.ptr;
      (b->arguments).d.ptr = (ArgumentDef *)0x0;
      pFVar1[qVar18].arguments.d.ptr = pAVar6;
      qVar4 = (b->arguments).d.size;
      (b->arguments).d.size = 0;
      pFVar1[qVar18].arguments.d.size = qVar4;
      pDVar2 = (b->normalizedType).d.d;
      (b->normalizedType).d.d = (Data *)0x0;
      pFVar1[qVar18].normalizedType.d.d = pDVar2;
      pcVar3 = (b->normalizedType).d.ptr;
      (b->normalizedType).d.ptr = (char *)0x0;
      pFVar1[qVar18].normalizedType.d.ptr = pcVar3;
      qVar4 = (b->normalizedType).d.size;
      (b->normalizedType).d.size = 0;
      pFVar1[qVar18].normalizedType.d.size = qVar4;
      pDVar2 = (b->tag).d.d;
      (b->tag).d.d = (Data *)0x0;
      pFVar1[qVar18].tag.d.d = pDVar2;
      pcVar3 = (b->tag).d.ptr;
      (b->tag).d.ptr = (char *)0x0;
      pFVar1[qVar18].tag.d.ptr = pcVar3;
      qVar4 = (b->tag).d.size;
      (b->tag).d.size = 0;
      pFVar1[qVar18].tag.d.size = qVar4;
      pDVar2 = (b->name).d.d;
      (b->name).d.d = (Data *)0x0;
      pFVar1[qVar18].name.d.d = pDVar2;
      pcVar3 = (b->name).d.ptr;
      (b->name).d.ptr = (char *)0x0;
      pFVar1[qVar18].name.d.ptr = pcVar3;
      qVar4 = (b->name).d.size;
      (b->name).d.size = 0;
      pFVar1[qVar18].name.d.size = qVar4;
      pDVar2 = (b->inPrivateClass).d.d;
      (b->inPrivateClass).d.d = (Data *)0x0;
      pFVar1[qVar18].inPrivateClass.d.d = pDVar2;
      pcVar3 = (b->inPrivateClass).d.ptr;
      (b->inPrivateClass).d.ptr = (char *)0x0;
      pFVar1[qVar18].inPrivateClass.d.ptr = pcVar3;
      qVar4 = (b->inPrivateClass).d.size;
      (b->inPrivateClass).d.size = 0;
      pFVar1[qVar18].inPrivateClass.d.size = qVar4;
      iVar10 = b->revision;
      uVar7 = *(undefined8 *)&b->isConst;
      pFVar8 = pFVar1 + qVar18;
      pFVar8->access = b->access;
      pFVar8->revision = iVar10;
      *(undefined8 *)(&pFVar8->access + 2) = uVar7;
      bVar11 = b->isSlot;
      bVar12 = b->isSignal;
      bVar13 = b->isPrivateSignal;
      bVar14 = b->isConstructor;
      bVar15 = b->isDestructor;
      bVar16 = b->isAbstract;
      bVar17 = b->isRawSlot;
      pFVar8 = pFVar1 + qVar18;
      pFVar8->isScriptable = b->isScriptable;
      pFVar8->isSlot = bVar11;
      pFVar8->isSignal = bVar12;
      pFVar8->isPrivateSignal = bVar13;
      pFVar8->isConstructor = bVar14;
      pFVar8->isDestructor = bVar15;
      pFVar8->isAbstract = bVar16;
      pFVar8->isRawSlot = bVar17;
      b = b + 1;
      qVar18 = (this->super_QArrayDataPointer<FunctionDef>).size + 1;
      (this->super_QArrayDataPointer<FunctionDef>).size = qVar18;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }